

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool,false,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uhugeint_t uVar10;
  uhugeint_t local_68;
  uhugeint_t local_58;
  ulong local_48;
  idx_t local_40;
  ValidityMask *local_38;
  
  local_38 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar6 = 0;
      do {
        puVar1 = (uint64_t *)((long)&ldata->lower + lVar6);
        local_68.lower = *puVar1;
        local_68.upper = puVar1[1];
        puVar1 = (uint64_t *)((long)&rdata->lower + lVar6);
        local_58.lower = *puVar1;
        local_58.upper = puVar1[1];
        uVar10 = uhugeint_t::operator&(&local_68,&local_58);
        *(uint64_t *)((long)&result_data->lower + lVar6) = uVar10.lower;
        *(uint64_t *)((long)&result_data->upper + lVar6) = uVar10.upper;
        lVar6 = lVar6 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    uVar7 = 0;
    uVar5 = 0;
    local_40 = count;
    do {
      puVar2 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar9 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar9 = count;
        }
LAB_01aeba56:
        uVar4 = uVar7;
        if (uVar7 < uVar9) {
          lVar6 = uVar7 << 4;
          do {
            puVar1 = (uint64_t *)((long)&ldata->lower + lVar6);
            local_68.lower = *puVar1;
            local_68.upper = puVar1[1];
            puVar1 = (uint64_t *)((long)&rdata->lower + lVar6);
            local_58.lower = *puVar1;
            local_58.upper = puVar1[1];
            uVar10 = uhugeint_t::operator&(&local_68,&local_58);
            *(uint64_t *)((long)&result_data->lower + lVar6) = uVar10.lower;
            *(uint64_t *)((long)&result_data->upper + lVar6) = uVar10.upper;
            uVar7 = uVar7 + 1;
            lVar6 = lVar6 + 0x10;
            uVar4 = uVar9;
          } while (uVar9 != uVar7);
        }
      }
      else {
        uVar3 = puVar2[uVar5];
        uVar9 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar9 = count;
        }
        uVar4 = uVar9;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_01aeba56;
          uVar4 = uVar7;
          if (uVar7 < uVar9) {
            lVar6 = uVar7 << 4;
            uVar8 = 0;
            do {
              if ((uVar3 >> (uVar8 & 0x3f) & 1) != 0) {
                puVar1 = (uint64_t *)((long)&ldata->lower + lVar6);
                local_68.lower = *puVar1;
                local_68.upper = puVar1[1];
                puVar1 = (uint64_t *)((long)&rdata->lower + lVar6);
                local_58.lower = *puVar1;
                local_58.upper = puVar1[1];
                uVar10 = uhugeint_t::operator&(&local_68,&local_58);
                *(uint64_t *)((long)&result_data->lower + lVar6) = uVar10.lower;
                *(uint64_t *)((long)&result_data->upper + lVar6) = uVar10.upper;
              }
              uVar8 = uVar8 + 1;
              lVar6 = lVar6 + 0x10;
              count = local_40;
              uVar4 = uVar9;
            } while (uVar9 - uVar7 != uVar8);
          }
        }
      }
      uVar7 = uVar4;
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_48);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}